

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::SetHeadAndLastUsedSegment
          (JavascriptArray *this,SparseArraySegmentBase *segment)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WriteBarrierPtr<Js::SparseArraySegmentBase> *other;
  SparseArraySegmentBase *segment_local;
  JavascriptArray *this_local;
  
  bVar2 = HasSegmentMap(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa3a,"(!HasSegmentMap())","!HasSegmentMap()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  other = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                    (&(this->segmentUnion).lastUsedSegment,segment);
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&this->head,other);
  return;
}

Assistant:

void JavascriptArray::SetHeadAndLastUsedSegment(SparseArraySegmentBase * segment)
    {

        Assert(!HasSegmentMap());
        this->head = this->segmentUnion.lastUsedSegment = segment;
    }